

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O1

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::AnalyzePhiInstruction
          (ScalarEvolutionAnalysis *this,Instruction *phi)

{
  IRContext *this_00;
  DefUseManager *pDVar1;
  ulong uVar2;
  key_type pLVar3;
  long *plVar4;
  ScalarEvolutionAnalysis *pSVar5;
  bool bVar6;
  undefined8 uVar7;
  bool bVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  int iVar11;
  BasicBlock *pBVar12;
  LoopDescriptor *pLVar13;
  _Hash_node_base *p_Var14;
  mapped_type *ppSVar15;
  mapped_type *ppLVar16;
  key_type *__k;
  ScalarEvolutionAnalysis *pSVar17;
  Instruction *pIVar18;
  long lVar19;
  __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
  __position;
  mapped_type pSVar20;
  ScalarEvolutionAnalysis *pSVar21;
  uint uVar22;
  ulong uVar23;
  ScalarEvolutionAnalysis *this_01;
  __node_base_ptr p_Var24;
  __node_base_ptr p_Var25;
  uint uVar26;
  bool bVar27;
  Loop *loop;
  undefined1 local_78 [48];
  map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
  *local_48;
  DefUseManager *local_40;
  __uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_38;
  
  uVar22 = (phi->has_result_id_ & 1) + 1;
  if (phi->has_type_id_ == false) {
    uVar22 = (uint)phi->has_result_id_;
  }
  if ((int)((ulong)((long)(phi->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(phi->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar22 ==
      4) {
    this_00 = this->context_;
    local_78._0_8_ = phi;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    pDVar1 = (this_00->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    pBVar12 = IRContext::get_instr_block(this->context_,(Instruction *)local_78._0_8_);
    pLVar13 = IRContext::GetLoopDescriptor(this->context_,pBVar12->function_);
    if (pLVar13 != (LoopDescriptor *)0x0) {
      pIVar18 = (pBVar12->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar9 = 0;
      if (pIVar18->has_result_id_ == true) {
        uVar9 = Instruction::GetSingleWordOperand(pIVar18,(uint)pIVar18->has_type_id_);
      }
      uVar2 = (pLVar13->basic_block_to_loop_)._M_h._M_bucket_count;
      uVar23 = (ulong)uVar9 % uVar2;
      p_Var24 = (pLVar13->basic_block_to_loop_)._M_h._M_buckets[uVar23];
      p_Var25 = (__node_base_ptr)0x0;
      if ((p_Var24 != (__node_base_ptr)0x0) &&
         (p_Var14 = p_Var24->_M_nxt, p_Var25 = p_Var24, *(uint *)&p_Var24->_M_nxt[1]._M_nxt != uVar9
         )) {
        while (p_Var24 = p_Var14, p_Var14 = p_Var24->_M_nxt, p_Var14 != (_Hash_node_base *)0x0) {
          p_Var25 = (__node_base_ptr)0x0;
          if (((ulong)*(uint *)&p_Var14[1]._M_nxt % uVar2 != uVar23) ||
             (p_Var25 = p_Var24, *(uint *)&p_Var14[1]._M_nxt == uVar9)) goto LAB_0060ce0e;
        }
        p_Var25 = (__node_base_ptr)0x0;
      }
LAB_0060ce0e:
      if (p_Var25 == (__node_base_ptr)0x0) {
        p_Var14 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var14 = p_Var25->_M_nxt;
      }
      if (p_Var14 == (_Hash_node_base *)0x0) {
        local_78._24_8_ = (Loop *)0x0;
      }
      else {
        local_78._24_8_ = p_Var14[2]._M_nxt;
      }
      if (((((Loop *)local_78._24_8_ == (Loop *)0x0) ||
           (((Loop *)local_78._24_8_)->loop_latch_ == (BasicBlock *)0x0)) ||
          (((Loop *)local_78._24_8_)->loop_preheader_ == (BasicBlock *)0x0)) ||
         (((Loop *)local_78._24_8_)->loop_header_ != pBVar12)) {
        pSVar20 = this->cached_cant_compute_;
        ppSVar15 = std::
                   map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                   ::operator[](&this->recurrent_node_map_,(key_type *)local_78);
        *ppSVar15 = pSVar20;
        return pSVar20;
      }
      __k = (key_type *)(local_78 + 0x18);
      ppLVar16 = std::
                 map<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_const_spvtools::opt::Loop_*>_>_>
                 ::operator[](&this->pretend_equal_,__k);
      if (*ppLVar16 != (mapped_type)0x0) {
        __k = std::
              map<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_const_spvtools::opt::Loop_*>_>_>
              ::operator[](&this->pretend_equal_,(key_type *)(local_78 + 0x18));
      }
      pLVar3 = *__k;
      pSVar17 = (ScalarEvolutionAnalysis *)operator_new(0x48);
      pSVar17->context_ = (IRContext *)&PTR___cxa_pure_virtual_00951a38;
      *(undefined8 *)&(pSVar17->recurrent_node_map_)._M_t._M_impl = 0;
      *(pointer *)&(pSVar17->recurrent_node_map_)._M_t._M_impl.super__Rb_tree_header._M_header =
           (pointer)0x0;
      (pSVar17->recurrent_node_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (pSVar17->recurrent_node_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)this;
      SENode::NumberOfNodes = SENode::NumberOfNodes + 1;
      *(int *)&(pSVar17->recurrent_node_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
           = SENode::NumberOfNodes;
      pSVar17->context_ = (IRContext *)&PTR_GetType_00951c48;
      (pSVar17->node_cache_)._M_h._M_buckets = (__buckets_ptr)pLVar3;
      local_78._8_8_ = &this->recurrent_node_map_;
      pSVar20 = (mapped_type)local_78;
      ppSVar15 = std::
                 map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                 ::operator[]((map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                               *)local_78._8_8_,(key_type *)pSVar20);
      *ppSVar15 = (mapped_type)pSVar17;
      uVar22 = (*(bool *)(local_78._0_8_ + 0x2d) & 1) + 1;
      if (*(bool *)(local_78._0_8_ + 0x2c) == false) {
        uVar22 = (uint)*(bool *)(local_78._0_8_ + 0x2d);
      }
      bVar27 = uVar22 != (int)((ulong)((long)(((OperandList *)(local_78._0_8_ + 0x38))->
                                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(((OperandList *)(local_78._0_8_ + 0x38))->
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            )._M_impl.super__Vector_impl_data._M_start) >> 4) *
                         -0x55555555;
      local_78._16_8_ = pSVar17;
      if (bVar27) {
        local_48 = &pSVar17->recurrent_node_map_;
        uVar26 = 0;
        local_40 = pDVar1;
        do {
          uVar9 = Instruction::GetSingleWordOperand((Instruction *)local_78._0_8_,uVar22 + uVar26);
          uVar22 = (*(bool *)(local_78._0_8_ + 0x2d) & 1) + 1;
          if (*(bool *)(local_78._0_8_ + 0x2c) == false) {
            uVar22 = (uint)*(bool *)(local_78._0_8_ + 0x2d);
          }
          uVar10 = Instruction::GetSingleWordOperand
                             ((Instruction *)local_78._0_8_,uVar22 + uVar26 + 1);
          pIVar18 = analysis::DefUseManager::GetDef(local_40,uVar9);
          pSVar17 = (ScalarEvolutionAnalysis *)AnalyzeInstruction(this,pIVar18);
          iVar11 = (*(code *)pSVar17->context_->syntax_context_)(pSVar17);
          if (iVar11 == 6) goto LAB_0060cfa2;
          pIVar18 = ((*(BasicBlock **)(local_78._24_8_ + 0x20))->label_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          uVar9 = 0;
          if (pIVar18->has_result_id_ == true) {
            uVar9 = Instruction::GetSingleWordOperand(pIVar18,(uint)pIVar18->has_type_id_);
          }
          uVar7 = local_78._16_8_;
          if (uVar10 == uVar9) {
            *(ScalarEvolutionAnalysis **)(local_78._16_8_ + 0x38) = pSVar17;
            local_78._32_8_ = pSVar17;
            lVar19 = (*(code *)((*(IRContext **)local_78._16_8_)->grammar_).extInstTable_)
                               (local_78._16_8_);
            if (lVar19 != 0) {
              __assert_fail("false && \"Trying to add a child node to a constant!\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis_nodes.h"
                            ,0x43,"virtual void spvtools::opt::SENode::AddChild(SENode *)");
            }
            __position = std::
                         __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::SENode**,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>,__gnu_cxx::__ops::_Iter_negate<spvtools::opt::SENode::AddChild(spvtools::opt::SENode*)::_lambda(spvtools::opt::SENode_const*)_1_>>
                                   (*(undefined8 *)
                                     &(((map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                                         *)(uVar7 + 8))->_M_t)._M_impl,
                                    *(pointer *)
                                     &(((map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                                         *)(uVar7 + 8))->_M_t)._M_impl.super__Rb_tree_header.
                                      _M_header,local_78._32_8_);
            std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::insert
                      ((vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *)
                       local_48,(const_iterator)__position._M_current,
                       (value_type *)(local_78 + 0x20));
            bVar6 = true;
          }
          else {
            pIVar18 = ((*(BasicBlock **)(local_78._24_8_ + 0x28))->label_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
            uVar9 = 0;
            if (pIVar18->has_result_id_ == true) {
              uVar9 = Instruction::GetSingleWordOperand(pIVar18,(uint)pIVar18->has_type_id_);
            }
            bVar6 = true;
            if (uVar10 == uVar9) {
              iVar11 = (*(code *)pSVar17->context_->syntax_context_)(pSVar17);
              if (iVar11 == 2) {
                plVar4 = *(long **)&(pSVar17->recurrent_node_map_)._M_t._M_impl;
                pSVar17 = (ScalarEvolutionAnalysis *)*plVar4;
                pSVar5 = (ScalarEvolutionAnalysis *)plVar4[1];
                lVar19 = (*(code *)(pSVar17->context_->module_)._M_t.
                                   super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                                   .super__Head_base<0UL,_spvtools::opt::Module_*,_false>.
                                   _M_head_impl)(pSVar17);
                pSVar21 = pSVar17;
                if ((lVar19 != 0) &&
                   (lVar19 = (*(code *)(pSVar5->context_->module_)._M_t.
                                       super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                                       .super__Head_base<0UL,_spvtools::opt::Module_*,_false>.
                                       _M_head_impl)(pSVar5), pSVar21 = pSVar5, lVar19 != 0)) {
                  pSVar21 = (ScalarEvolutionAnalysis *)0x0;
                }
                this_01 = pSVar17;
                local_78._40_8_ = pSVar21;
                lVar19 = (*(code *)(pSVar17->context_->module_)._M_t.
                                   super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                                   .super__Head_base<0UL,_spvtools::opt::Module_*,_false>.
                                   _M_head_impl)();
                if ((lVar19 == 0) &&
                   (this_01 = pSVar5,
                   pSVar17 = (ScalarEvolutionAnalysis *)
                             (*(code *)(pSVar5->context_->module_)._M_t.
                                       super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                                       .super__Head_base<0UL,_spvtools::opt::Module_*,_false>.
                                       _M_head_impl)(), pSVar17 != (ScalarEvolutionAnalysis *)0x0))
                {
                  pSVar17 = pSVar5;
                }
                uVar7 = local_78._40_8_;
                if (((((ScalarEvolutionAnalysis *)local_78._40_8_ != (ScalarEvolutionAnalysis *)0x0)
                     && (pSVar17 != (ScalarEvolutionAnalysis *)0x0)) &&
                    (pSVar17 == (ScalarEvolutionAnalysis *)local_78._16_8_)) &&
                   (bVar8 = IsLoopInvariant(this_01,(Loop *)local_78._24_8_,
                                            (SENode *)local_78._40_8_), bVar8)) {
                  SERecurrentNode::AddCoefficient
                            ((SERecurrentNode *)local_78._16_8_,(SENode *)uVar7);
                  goto LAB_0060d109;
                }
              }
LAB_0060cfa2:
              pSVar20 = this->cached_cant_compute_;
              ppSVar15 = std::
                         map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                         ::operator[]((map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                                       *)local_78._8_8_,(key_type *)local_78);
              *ppSVar15 = pSVar20;
              bVar6 = false;
            }
          }
LAB_0060d109:
          if (!bVar6) break;
          uVar26 = uVar26 + 2;
          uVar22 = (*(bool *)(local_78._0_8_ + 0x2d) & 1) + 1;
          if (*(bool *)(local_78._0_8_ + 0x2c) == false) {
            uVar22 = (uint)*(bool *)(local_78._0_8_ + 0x2d);
          }
          bVar27 = uVar26 < (int)((ulong)((long)(((OperandList *)(local_78._0_8_ + 0x38))->
                                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(((OperandList *)(local_78._0_8_ + 0x38))->
                                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                               )._M_impl.super__Vector_impl_data._M_start) >> 4) *
                            -0x55555555 - uVar22;
        } while (bVar27);
      }
      pSVar17 = (ScalarEvolutionAnalysis *)local_78._16_8_;
      if (!bVar27) {
        local_38._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
        .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
             (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
             (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
             local_78._16_8_;
        pSVar20 = GetCachedOrAdd(this,(unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                                       *)&local_38);
        ppSVar15 = std::
                   map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                   ::operator[]((map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                                 *)local_78._8_8_,(key_type *)local_78);
        *ppSVar15 = pSVar20;
        if (local_38._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
            .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl !=
            (_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
            0x0) {
          (**(code **)(*(long *)local_38._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                                .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl
                      + 0x10))();
        }
        local_38._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
        .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
             (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
             (_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
             )0x0;
        pSVar17 = (ScalarEvolutionAnalysis *)0x0;
      }
      if (pSVar17 == (ScalarEvolutionAnalysis *)0x0) {
        return pSVar20;
      }
      (*(code *)(pSVar17->context_->grammar_).operandTable_)();
      return pSVar20;
    }
  }
  return this->cached_cant_compute_;
}

Assistant:

SENode* ScalarEvolutionAnalysis::AnalyzePhiInstruction(const Instruction* phi) {
  // The phi should only have two incoming value pairs.
  if (phi->NumInOperands() != 4) {
    return CreateCantComputeNode();
  }

  analysis::DefUseManager* def_use = context_->get_def_use_mgr();

  // Get the basic block this instruction belongs to.
  BasicBlock* basic_block =
      context_->get_instr_block(const_cast<Instruction*>(phi));

  // And then the function that the basic blocks belongs to.
  Function* function = basic_block->GetParent();

  // Use the function to get the loop descriptor.
  LoopDescriptor* loop_descriptor = context_->GetLoopDescriptor(function);

  // We only handle phis in loops at the moment.
  if (!loop_descriptor) return CreateCantComputeNode();

  // Get the innermost loop which this block belongs to.
  Loop* loop = (*loop_descriptor)[basic_block->id()];

  // If the loop doesn't exist or doesn't have a preheader or latch block, exit
  // out.
  if (!loop || !loop->GetLatchBlock() || !loop->GetPreHeaderBlock() ||
      loop->GetHeaderBlock() != basic_block)
    return recurrent_node_map_[phi] = CreateCantComputeNode();

  const Loop* loop_to_use = nullptr;
  if (pretend_equal_[loop]) {
    loop_to_use = pretend_equal_[loop];
  } else {
    loop_to_use = loop;
  }
  std::unique_ptr<SERecurrentNode> phi_node{
      new SERecurrentNode(this, loop_to_use)};

  // We add the node to this map to allow it to be returned before the node is
  // fully built. This is needed as the subsequent call to AnalyzeInstruction
  // could lead back to this |phi| instruction so we return the pointer
  // immediately in AnalyzeInstruction to break the recursion.
  recurrent_node_map_[phi] = phi_node.get();

  // Traverse the operands of the instruction an create new nodes for each one.
  for (uint32_t i = 0; i < phi->NumInOperands(); i += 2) {
    uint32_t value_id = phi->GetSingleWordInOperand(i);
    uint32_t incoming_label_id = phi->GetSingleWordInOperand(i + 1);

    Instruction* value_inst = def_use->GetDef(value_id);
    SENode* value_node = AnalyzeInstruction(value_inst);

    // If any operand is CantCompute then the whole graph is CantCompute.
    if (value_node->IsCantCompute())
      return recurrent_node_map_[phi] = CreateCantComputeNode();

    // If the value is coming from the preheader block then the value is the
    // initial value of the phi.
    if (incoming_label_id == loop->GetPreHeaderBlock()->id()) {
      phi_node->AddOffset(value_node);
    } else if (incoming_label_id == loop->GetLatchBlock()->id()) {
      // Assumed to be in the form of step + phi.
      if (value_node->GetType() != SENode::Add)
        return recurrent_node_map_[phi] = CreateCantComputeNode();

      SENode* step_node = nullptr;
      SENode* phi_operand = nullptr;
      SENode* operand_1 = value_node->GetChild(0);
      SENode* operand_2 = value_node->GetChild(1);

      // Find which node is the step term.
      if (!operand_1->AsSERecurrentNode())
        step_node = operand_1;
      else if (!operand_2->AsSERecurrentNode())
        step_node = operand_2;

      // Find which node is the recurrent expression.
      if (operand_1->AsSERecurrentNode())
        phi_operand = operand_1;
      else if (operand_2->AsSERecurrentNode())
        phi_operand = operand_2;

      // If it is not in the form step + phi exit out.
      if (!(step_node && phi_operand))
        return recurrent_node_map_[phi] = CreateCantComputeNode();

      // If the phi operand is not the same phi node exit out.
      if (phi_operand != phi_node.get())
        return recurrent_node_map_[phi] = CreateCantComputeNode();

      if (!IsLoopInvariant(loop, step_node))
        return recurrent_node_map_[phi] = CreateCantComputeNode();

      phi_node->AddCoefficient(step_node);
    }
  }

  // Once the node is fully built we update the map with the version from the
  // cache (if it has already been added to the cache).
  return recurrent_node_map_[phi] = GetCachedOrAdd(std::move(phi_node));
}